

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *this,size_t new_capacity)

{
  ctrl_t *__s;
  Layout LVar1;
  
  if (new_capacity != 0) {
    LVar1 = MakeLayout(new_capacity);
    __s = (ctrl_t *)
          Allocate<1ul,std::allocator<std::pair<char_const,char>>>
                    ((allocator<std::pair<const_char,_char>_> *)&this->settings_,
                     LVar1.
                     super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<char,_char>_>
                     .size_[0] +
                     LVar1.
                     super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<char,_char>_>
                     .size_[1] * 2);
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)
                   (__s + LVar1.
                          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<char,_char>_>
                          .size_[0]);
    memset(__s,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    return;
  }
  __assert_fail("new_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8b8,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char, char>, phmap::Hash<char>, phmap::EqualTo<char>, std::allocator<std::pair<const char, char>>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashMapPolicy<char, char>, Hash = phmap::Hash<char>, Eq = phmap::EqualTo<char>, Alloc = std::allocator<std::pair<const char, char>>]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity)
			{
				assert(new_capacity);
				if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value &&
				        slots_ == nullptr) {
					infoz_ = Sample();
				}

				auto layout = MakeLayout(new_capacity);
				char* mem = static_cast<char*>(
				                Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
				ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
				slots_ = layout.template Pointer<1>(mem);
				reset_ctrl(new_capacity);
				reset_growth_left(new_capacity);
				infoz_.RecordStorageChanged(size_, new_capacity);
			}